

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceManager.cpp
# Opt level: O0

void __thiscall
OpenMD::ForceManager::selectedShortRangeInteractions
          (ForceManager *this,Molecule *mol1,Molecule *mol2)

{
  double dVar1;
  double dVar2;
  RealType RVar3;
  bool bVar4;
  double *pdVar5;
  pointer ppVar6;
  pointer ppVar7;
  pointer ppVar8;
  SnapshotManager *this_00;
  Snapshot *this_01;
  long in_RDI;
  RealType RVar9;
  pair<std::_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>,_bool> pVar10;
  pair<std::_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>,_bool>
  pVar11;
  pair<std::_Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>,_bool>
  pVar12;
  Snapshot *curSnapshot;
  InversionDataSet dataSet_5;
  iterator i_5;
  RealType currInversionPot_1;
  RealType angle_5;
  TorsionDataSet dataSet_4;
  iterator i_4;
  RealType currTorsionPot_1;
  RealType angle_4;
  BendDataSet dataSet_3;
  iterator i_3;
  RealType currBendPot_1;
  RealType angle_3;
  InversionDataSet dataSet_2;
  iterator i_2;
  RealType currInversionPot;
  RealType angle_2;
  TorsionDataSet dataSet_1;
  iterator i_1;
  RealType currTorsionPot;
  RealType angle_1;
  BendDataSet dataSet;
  iterator i;
  RealType currBendPot;
  RealType angle;
  potVec selectionPotential;
  RealType inversionPotential;
  RealType torsionPotential;
  RealType bendPotential;
  RealType bondPotential;
  InversionIterator inversionIter;
  TorsionIterator torsionIter;
  BendIterator bendIter;
  BondIterator bondIter;
  RigidBodyIterator rbIter;
  MoleculeIterator mi;
  Inversion *inversion;
  Torsion *torsion;
  Bend *bend;
  Bond *bond;
  RigidBody *rb;
  StuntDouble *in_stack_fffffffffffff948;
  SelectionManager *in_stack_fffffffffffff950;
  value_type *in_stack_fffffffffffff958;
  Vector<double,_7U> *in_stack_fffffffffffff960;
  iterator *in_stack_fffffffffffff968;
  Molecule *in_stack_fffffffffffff970;
  undefined8 in_stack_fffffffffffffa28;
  Bond *in_stack_fffffffffffffa30;
  RigidBody *in_stack_fffffffffffffae0;
  _Self local_398;
  _Self local_390;
  RealType local_388;
  RealType local_380;
  _Base_ptr local_378;
  undefined1 local_370;
  undefined8 local_338;
  RealType local_330;
  RealType local_328;
  RealType local_320;
  RealType local_318;
  _Self local_310;
  _Self local_308;
  RealType local_300;
  RealType local_2f8;
  _Base_ptr local_2f0;
  undefined1 local_2e8;
  undefined8 local_2b0;
  RealType local_2a8;
  RealType local_2a0;
  RealType local_298;
  RealType local_290;
  _Self local_288;
  _Self local_280;
  RealType local_278;
  RealType local_270;
  _Base_ptr local_268;
  undefined1 local_260;
  undefined8 local_228;
  RealType local_220;
  RealType local_218;
  RealType local_210;
  RealType local_208;
  _Self local_200;
  _Self local_1f8;
  RealType local_1f0;
  RealType local_1e8;
  _Base_ptr local_1e0;
  undefined1 local_1d8;
  undefined8 local_1a0;
  RealType local_198;
  RealType local_190;
  RealType local_188;
  RealType local_180;
  _Self local_178;
  _Self local_170;
  RealType local_168;
  RealType local_160;
  _Base_ptr local_158;
  undefined1 local_150;
  undefined8 local_118;
  RealType local_110;
  RealType local_108;
  RealType local_100;
  RealType local_f8;
  _Self local_f0;
  _Self local_e8;
  RealType local_e0;
  RealType local_d8;
  double local_d0;
  Vector<double,_7U> local_c8;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  __normal_iterator<OpenMD::Inversion_**,_std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>_>
  local_70;
  __normal_iterator<OpenMD::Torsion_**,_std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>_>
  local_68;
  __normal_iterator<OpenMD::Bend_**,_std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>_>
  local_60;
  __normal_iterator<OpenMD::Bond_**,_std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>_>
  local_58;
  __normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
  local_50;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_48;
  Inversion *local_40;
  Torsion *local_38;
  Bend *local_30;
  Bond *local_28;
  RigidBody *local_20;
  
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_48);
  __gnu_cxx::
  __normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
  ::__normal_iterator(&local_50);
  __gnu_cxx::
  __normal_iterator<OpenMD::Bond_**,_std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>_>
  ::__normal_iterator(&local_58);
  __gnu_cxx::
  __normal_iterator<OpenMD::Bend_**,_std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>_>
  ::__normal_iterator(&local_60);
  __gnu_cxx::
  __normal_iterator<OpenMD::Torsion_**,_std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>_>
  ::__normal_iterator(&local_68);
  __gnu_cxx::
  __normal_iterator<OpenMD::Inversion_**,_std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>_>
  ::__normal_iterator(&local_70);
  local_78 = 0.0;
  local_80 = 0.0;
  local_88 = 0.0;
  local_90 = 0.0;
  local_d0 = 0.0;
  Vector<double,_7U>::Vector(&local_c8,&local_d0);
  local_20 = Molecule::beginRigidBody(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
  while (local_20 != (RigidBody *)0x0) {
    RigidBody::updateAtoms(in_stack_fffffffffffffae0);
    local_20 = Molecule::nextRigidBody(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
  }
  local_28 = Molecule::beginBond(in_stack_fffffffffffff970,(iterator *)in_stack_fffffffffffff968);
  while (local_28 != (Bond *)0x0) {
    Bond::calcForce(in_stack_fffffffffffffa30,SUB81((ulong)in_stack_fffffffffffffa28 >> 0x38,0));
    RVar9 = Bond::getPotential(local_28);
    local_78 = RVar9 + local_78;
    if ((*(byte *)(in_RDI + 0x220) & 1) != 0) {
      Bond::getAtomA((Bond *)0x3191f2);
      bVar4 = SelectionManager::isSelected(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
      if (!bVar4) {
        Bond::getAtomB((Bond *)0x319229);
        bVar4 = SelectionManager::isSelected(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
        if (!bVar4) goto LAB_0031927a;
      }
      RVar9 = Bond::getPotential(local_28);
      pdVar5 = Vector<double,_7U>::operator[](&local_c8,6);
      *pdVar5 = RVar9 + *pdVar5;
    }
LAB_0031927a:
    local_28 = Molecule::nextBond(in_stack_fffffffffffff970,(iterator *)in_stack_fffffffffffff968);
  }
  local_30 = Molecule::beginBend(in_stack_fffffffffffff970,(iterator *)in_stack_fffffffffffff968);
  while (local_30 != (Bend *)0x0) {
    (*(local_30->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[9])
              (local_30,&local_d8,(ulong)(*(byte *)(in_RDI + 9) & 1));
    local_e0 = Bend::getPotential(local_30);
    RVar9 = Bend::getPotential(local_30);
    local_80 = RVar9 + local_80;
    local_e8._M_node =
         (_Base_ptr)
         std::
         map<OpenMD::Bend_*,_OpenMD::BendDataSet,_std::less<OpenMD::Bend_*>,_std::allocator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>_>
         ::find((map<OpenMD::Bend_*,_OpenMD::BendDataSet,_std::less<OpenMD::Bend_*>,_std::allocator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>_>
                 *)in_stack_fffffffffffff948,(key_type *)0x319342);
    local_f0._M_node =
         (_Base_ptr)
         std::
         map<OpenMD::Bend_*,_OpenMD::BendDataSet,_std::less<OpenMD::Bend_*>,_std::allocator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>_>
         ::end((map<OpenMD::Bend_*,_OpenMD::BendDataSet,_std::less<OpenMD::Bend_*>,_std::allocator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>_>
                *)in_stack_fffffffffffff948);
    bVar4 = std::operator==(&local_e8,&local_f0);
    if (bVar4) {
      local_100 = local_d8;
      local_110 = local_d8;
      local_f8 = local_e0;
      local_108 = local_e0;
      local_118 = 0;
      std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>::
      pair<OpenMD::Bend_*&,_OpenMD::BendDataSet_&,_true>
                ((pair<OpenMD::Bend_*const,_OpenMD::BendDataSet> *)in_stack_fffffffffffff950,
                 (Bend **)in_stack_fffffffffffff948,(BendDataSet *)0x3193f9);
      pVar10 = std::
               map<OpenMD::Bend_*,_OpenMD::BendDataSet,_std::less<OpenMD::Bend_*>,_std::allocator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>_>
               ::insert((map<OpenMD::Bend_*,_OpenMD::BendDataSet,_std::less<OpenMD::Bend_*>,_std::allocator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>_>
                         *)in_stack_fffffffffffff960,(value_type *)in_stack_fffffffffffff958);
      local_158 = (_Base_ptr)pVar10.first._M_node;
      local_150 = pVar10.second;
    }
    else {
      ppVar6 = std::_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_> *
                          )0x31942f);
      RVar9 = (ppVar6->second).curr.angle;
      ppVar6 = std::_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_> *
                          )0x31944a);
      (ppVar6->second).prev.angle = RVar9;
      ppVar6 = std::_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_> *
                          )0x319465);
      RVar9 = (ppVar6->second).curr.potential;
      ppVar6 = std::_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_> *
                          )0x319480);
      RVar3 = local_d8;
      (ppVar6->second).prev.potential = RVar9;
      ppVar6 = std::_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_> *
                          )0x3194ad);
      RVar9 = local_e0;
      (ppVar6->second).curr.angle = RVar3;
      ppVar6 = std::_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_> *
                          )0x3194da);
      (ppVar6->second).curr.potential = RVar9;
      ppVar6 = std::_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_> *
                          )0x3194f5);
      dVar1 = (ppVar6->second).curr.potential;
      ppVar6 = std::_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_> *
                          )0x319510);
      dVar2 = (ppVar6->second).prev.potential;
      ppVar6 = std::_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_> *
                          )0x31953f);
      (ppVar6->second).deltaV = ABS(dVar1 - dVar2);
    }
    if ((*(byte *)(in_RDI + 0x220) & 1) != 0) {
      Bend::getAtomA((Bend *)0x319585);
      bVar4 = SelectionManager::isSelected(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
      if (!bVar4) {
        Bend::getAtomB((Bend *)0x3195bc);
        bVar4 = SelectionManager::isSelected(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
        if (!bVar4) {
          Bend::getAtomC((Bend *)0x3195f3);
          bVar4 = SelectionManager::isSelected(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
          if (!bVar4) goto LAB_00319644;
        }
      }
      RVar9 = Bend::getPotential(local_30);
      pdVar5 = Vector<double,_7U>::operator[](&local_c8,6);
      *pdVar5 = RVar9 + *pdVar5;
    }
LAB_00319644:
    local_30 = Molecule::nextBend(in_stack_fffffffffffff970,(iterator *)in_stack_fffffffffffff968);
  }
  local_38 = Molecule::beginTorsion(in_stack_fffffffffffff970,(iterator *)in_stack_fffffffffffff968)
  ;
  while (local_38 != (Torsion *)0x0) {
    (*(local_38->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[9])
              (local_38,&local_160,(ulong)(*(byte *)(in_RDI + 9) & 1));
    local_168 = Torsion::getPotential(local_38);
    RVar9 = Torsion::getPotential(local_38);
    local_88 = RVar9 + local_88;
    local_170._M_node =
         (_Base_ptr)
         std::
         map<OpenMD::Torsion_*,_OpenMD::TorsionDataSet,_std::less<OpenMD::Torsion_*>,_std::allocator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>_>
         ::find((map<OpenMD::Torsion_*,_OpenMD::TorsionDataSet,_std::less<OpenMD::Torsion_*>,_std::allocator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>_>
                 *)in_stack_fffffffffffff948,(key_type *)0x31970c);
    local_178._M_node =
         (_Base_ptr)
         std::
         map<OpenMD::Torsion_*,_OpenMD::TorsionDataSet,_std::less<OpenMD::Torsion_*>,_std::allocator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>_>
         ::end((map<OpenMD::Torsion_*,_OpenMD::TorsionDataSet,_std::less<OpenMD::Torsion_*>,_std::allocator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>_>
                *)in_stack_fffffffffffff948);
    bVar4 = std::operator==(&local_170,&local_178);
    if (bVar4) {
      local_188 = local_160;
      local_198 = local_160;
      local_180 = local_168;
      local_190 = local_168;
      local_1a0 = 0;
      std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>::
      pair<OpenMD::Torsion_*&,_OpenMD::TorsionDataSet_&,_true>
                ((pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet> *)in_stack_fffffffffffff950,
                 (Torsion **)in_stack_fffffffffffff948,(TorsionDataSet *)0x3197c3);
      pVar11 = std::
               map<OpenMD::Torsion_*,_OpenMD::TorsionDataSet,_std::less<OpenMD::Torsion_*>,_std::allocator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>_>
               ::insert((map<OpenMD::Torsion_*,_OpenMD::TorsionDataSet,_std::less<OpenMD::Torsion_*>,_std::allocator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>_>
                         *)in_stack_fffffffffffff960,(value_type *)in_stack_fffffffffffff958);
      local_1e0 = (_Base_ptr)pVar11.first._M_node;
      local_1d8 = pVar11.second;
    }
    else {
      ppVar7 = std::_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>
                           *)0x3197f9);
      RVar9 = (ppVar7->second).curr.angle;
      ppVar7 = std::_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>
                           *)0x319814);
      (ppVar7->second).prev.angle = RVar9;
      ppVar7 = std::_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>
                           *)0x31982f);
      RVar9 = (ppVar7->second).curr.potential;
      ppVar7 = std::_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>
                           *)0x31984a);
      RVar3 = local_160;
      (ppVar7->second).prev.potential = RVar9;
      ppVar7 = std::_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>
                           *)0x319877);
      RVar9 = local_168;
      (ppVar7->second).curr.angle = RVar3;
      ppVar7 = std::_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>
                           *)0x3198a4);
      (ppVar7->second).curr.potential = RVar9;
      ppVar7 = std::_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>
                           *)0x3198bf);
      dVar1 = (ppVar7->second).curr.potential;
      ppVar7 = std::_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>
                           *)0x3198da);
      dVar2 = (ppVar7->second).prev.potential;
      ppVar7 = std::_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>
                           *)0x319909);
      (ppVar7->second).deltaV = ABS(dVar1 - dVar2);
    }
    if ((*(byte *)(in_RDI + 0x220) & 1) != 0) {
      Torsion::getAtomA((Torsion *)0x31994f);
      bVar4 = SelectionManager::isSelected(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
      if (!bVar4) {
        Torsion::getAtomB((Torsion *)0x31998a);
        bVar4 = SelectionManager::isSelected(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
        if (!bVar4) {
          Torsion::getAtomC((Torsion *)0x3199c1);
          bVar4 = SelectionManager::isSelected(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
          if (!bVar4) {
            Torsion::getAtomD((Torsion *)0x3199f8);
            bVar4 = SelectionManager::isSelected
                              (in_stack_fffffffffffff950,in_stack_fffffffffffff948);
            if (!bVar4) goto LAB_00319a49;
          }
        }
      }
      RVar9 = Torsion::getPotential(local_38);
      pdVar5 = Vector<double,_7U>::operator[](&local_c8,6);
      *pdVar5 = RVar9 + *pdVar5;
    }
LAB_00319a49:
    local_38 = Molecule::nextTorsion
                         (in_stack_fffffffffffff970,(iterator *)in_stack_fffffffffffff968);
  }
  local_40 = Molecule::beginInversion
                       (in_stack_fffffffffffff970,(iterator *)in_stack_fffffffffffff968);
  while (local_40 != (Inversion *)0x0) {
    (*(local_40->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[9])
              (local_40,&local_1e8,(ulong)(*(byte *)(in_RDI + 9) & 1));
    local_1f0 = Inversion::getPotential(local_40);
    RVar9 = Inversion::getPotential(local_40);
    local_90 = RVar9 + local_90;
    local_1f8._M_node =
         (_Base_ptr)
         std::
         map<OpenMD::Inversion_*,_OpenMD::InversionDataSet,_std::less<OpenMD::Inversion_*>,_std::allocator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>_>
         ::find((map<OpenMD::Inversion_*,_OpenMD::InversionDataSet,_std::less<OpenMD::Inversion_*>,_std::allocator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>_>
                 *)in_stack_fffffffffffff948,(key_type *)0x319b11);
    local_200._M_node =
         (_Base_ptr)
         std::
         map<OpenMD::Inversion_*,_OpenMD::InversionDataSet,_std::less<OpenMD::Inversion_*>,_std::allocator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>_>
         ::end((map<OpenMD::Inversion_*,_OpenMD::InversionDataSet,_std::less<OpenMD::Inversion_*>,_std::allocator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>_>
                *)in_stack_fffffffffffff948);
    bVar4 = std::operator==(&local_1f8,&local_200);
    if (bVar4) {
      local_210 = local_1e8;
      local_220 = local_1e8;
      local_208 = local_1f0;
      local_218 = local_1f0;
      local_228 = 0;
      in_stack_fffffffffffffae0 = (RigidBody *)(in_RDI + 0x118);
      std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>::
      pair<OpenMD::Inversion_*&,_OpenMD::InversionDataSet_&,_true>
                ((pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet> *)
                 in_stack_fffffffffffff950,(Inversion **)in_stack_fffffffffffff948,
                 (InversionDataSet *)0x319bc8);
      pVar12 = std::
               map<OpenMD::Inversion_*,_OpenMD::InversionDataSet,_std::less<OpenMD::Inversion_*>,_std::allocator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>_>
               ::insert((map<OpenMD::Inversion_*,_OpenMD::InversionDataSet,_std::less<OpenMD::Inversion_*>,_std::allocator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>_>
                         *)in_stack_fffffffffffff960,in_stack_fffffffffffff958);
      local_268 = (_Base_ptr)pVar12.first._M_node;
      local_260 = pVar12.second;
    }
    else {
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>
                           *)0x319bfe);
      RVar9 = (ppVar8->second).curr.angle;
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>
                           *)0x319c19);
      (ppVar8->second).prev.angle = RVar9;
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>
                           *)0x319c34);
      RVar9 = (ppVar8->second).curr.potential;
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>
                           *)0x319c4f);
      RVar3 = local_1e8;
      (ppVar8->second).prev.potential = RVar9;
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>
                           *)0x319c7c);
      RVar9 = local_1f0;
      (ppVar8->second).curr.angle = RVar3;
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>
                           *)0x319ca9);
      (ppVar8->second).curr.potential = RVar9;
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>
                           *)0x319cc4);
      dVar1 = (ppVar8->second).curr.potential;
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>
                           *)0x319cdf);
      dVar2 = (ppVar8->second).prev.potential;
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>
                           *)0x319d0e);
      (ppVar8->second).deltaV = ABS(dVar1 - dVar2);
    }
    if ((*(byte *)(in_RDI + 0x220) & 1) != 0) {
      Inversion::getAtomA((Inversion *)0x319d54);
      bVar4 = SelectionManager::isSelected(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
      if (!bVar4) {
        Inversion::getAtomB((Inversion *)0x319d8f);
        bVar4 = SelectionManager::isSelected(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
        if (!bVar4) {
          Inversion::getAtomC((Inversion *)0x319dc6);
          bVar4 = SelectionManager::isSelected(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
          if (!bVar4) {
            Inversion::getAtomD((Inversion *)0x319dfd);
            bVar4 = SelectionManager::isSelected
                              (in_stack_fffffffffffff950,in_stack_fffffffffffff948);
            if (!bVar4) goto LAB_00319e4e;
          }
        }
      }
      RVar9 = Inversion::getPotential(local_40);
      pdVar5 = Vector<double,_7U>::operator[](&local_c8,6);
      *pdVar5 = RVar9 + *pdVar5;
    }
LAB_00319e4e:
    local_40 = Molecule::nextInversion
                         (in_stack_fffffffffffff970,(iterator *)in_stack_fffffffffffff968);
  }
  local_20 = Molecule::beginRigidBody(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
  while (local_20 != (RigidBody *)0x0) {
    RigidBody::updateAtoms(in_stack_fffffffffffffae0);
    local_20 = Molecule::nextRigidBody(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
  }
  local_28 = Molecule::beginBond(in_stack_fffffffffffff970,(iterator *)in_stack_fffffffffffff968);
  while (local_28 != (Bond *)0x0) {
    Bond::calcForce(in_stack_fffffffffffffa30,SUB81((ulong)in_stack_fffffffffffffa28 >> 0x38,0));
    RVar9 = Bond::getPotential(local_28);
    local_78 = RVar9 + local_78;
    if ((*(byte *)(in_RDI + 0x220) & 1) != 0) {
      Bond::getAtomA((Bond *)0x319f66);
      bVar4 = SelectionManager::isSelected(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
      if (!bVar4) {
        Bond::getAtomB((Bond *)0x319f9d);
        bVar4 = SelectionManager::isSelected(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
        if (!bVar4) goto LAB_00319fee;
      }
      RVar9 = Bond::getPotential(local_28);
      pdVar5 = Vector<double,_7U>::operator[](&local_c8,6);
      *pdVar5 = RVar9 + *pdVar5;
    }
LAB_00319fee:
    local_28 = Molecule::nextBond(in_stack_fffffffffffff970,(iterator *)in_stack_fffffffffffff968);
  }
  local_30 = Molecule::beginBend(in_stack_fffffffffffff970,(iterator *)in_stack_fffffffffffff968);
  while (local_30 != (Bend *)0x0) {
    (*(local_30->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[9])
              (local_30,&local_270,(ulong)(*(byte *)(in_RDI + 9) & 1));
    local_278 = Bend::getPotential(local_30);
    RVar9 = Bend::getPotential(local_30);
    local_80 = RVar9 + local_80;
    local_280._M_node =
         (_Base_ptr)
         std::
         map<OpenMD::Bend_*,_OpenMD::BendDataSet,_std::less<OpenMD::Bend_*>,_std::allocator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>_>
         ::find((map<OpenMD::Bend_*,_OpenMD::BendDataSet,_std::less<OpenMD::Bend_*>,_std::allocator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>_>
                 *)in_stack_fffffffffffff948,(key_type *)0x31a0b6);
    local_288._M_node =
         (_Base_ptr)
         std::
         map<OpenMD::Bend_*,_OpenMD::BendDataSet,_std::less<OpenMD::Bend_*>,_std::allocator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>_>
         ::end((map<OpenMD::Bend_*,_OpenMD::BendDataSet,_std::less<OpenMD::Bend_*>,_std::allocator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>_>
                *)in_stack_fffffffffffff948);
    bVar4 = std::operator==(&local_280,&local_288);
    if (bVar4) {
      local_298 = local_270;
      local_2a8 = local_270;
      local_290 = local_278;
      local_2a0 = local_278;
      local_2b0 = 0;
      std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>::
      pair<OpenMD::Bend_*&,_OpenMD::BendDataSet_&,_true>
                ((pair<OpenMD::Bend_*const,_OpenMD::BendDataSet> *)in_stack_fffffffffffff950,
                 (Bend **)in_stack_fffffffffffff948,(BendDataSet *)0x31a16d);
      pVar10 = std::
               map<OpenMD::Bend_*,_OpenMD::BendDataSet,_std::less<OpenMD::Bend_*>,_std::allocator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>_>
               ::insert((map<OpenMD::Bend_*,_OpenMD::BendDataSet,_std::less<OpenMD::Bend_*>,_std::allocator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>_>
                         *)in_stack_fffffffffffff960,(value_type *)in_stack_fffffffffffff958);
      local_2f0 = (_Base_ptr)pVar10.first._M_node;
      local_2e8 = pVar10.second;
    }
    else {
      ppVar6 = std::_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_> *
                          )0x31a1a3);
      RVar9 = (ppVar6->second).curr.angle;
      ppVar6 = std::_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_> *
                          )0x31a1be);
      (ppVar6->second).prev.angle = RVar9;
      ppVar6 = std::_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_> *
                          )0x31a1d9);
      RVar9 = (ppVar6->second).curr.potential;
      ppVar6 = std::_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_> *
                          )0x31a1f4);
      RVar3 = local_270;
      (ppVar6->second).prev.potential = RVar9;
      ppVar6 = std::_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_> *
                          )0x31a221);
      RVar9 = local_278;
      (ppVar6->second).curr.angle = RVar3;
      ppVar6 = std::_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_> *
                          )0x31a24e);
      (ppVar6->second).curr.potential = RVar9;
      ppVar6 = std::_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_> *
                          )0x31a269);
      dVar1 = (ppVar6->second).curr.potential;
      ppVar6 = std::_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_> *
                          )0x31a284);
      dVar2 = (ppVar6->second).prev.potential;
      ppVar6 = std::_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_> *
                          )0x31a2b3);
      (ppVar6->second).deltaV = ABS(dVar1 - dVar2);
    }
    if ((*(byte *)(in_RDI + 0x220) & 1) != 0) {
      Bend::getAtomA((Bend *)0x31a2f9);
      bVar4 = SelectionManager::isSelected(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
      if (!bVar4) {
        Bend::getAtomB((Bend *)0x31a330);
        bVar4 = SelectionManager::isSelected(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
        if (!bVar4) {
          Bend::getAtomC((Bend *)0x31a367);
          bVar4 = SelectionManager::isSelected(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
          if (!bVar4) goto LAB_0031a3b8;
        }
      }
      RVar9 = Bend::getPotential(local_30);
      pdVar5 = Vector<double,_7U>::operator[](&local_c8,6);
      *pdVar5 = RVar9 + *pdVar5;
    }
LAB_0031a3b8:
    local_30 = Molecule::nextBend(in_stack_fffffffffffff970,(iterator *)in_stack_fffffffffffff968);
  }
  local_38 = Molecule::beginTorsion(in_stack_fffffffffffff970,(iterator *)in_stack_fffffffffffff968)
  ;
  while (local_38 != (Torsion *)0x0) {
    (*(local_38->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[9])
              (local_38,&local_2f8,(ulong)(*(byte *)(in_RDI + 9) & 1));
    local_300 = Torsion::getPotential(local_38);
    RVar9 = Torsion::getPotential(local_38);
    local_88 = RVar9 + local_88;
    local_308._M_node =
         (_Base_ptr)
         std::
         map<OpenMD::Torsion_*,_OpenMD::TorsionDataSet,_std::less<OpenMD::Torsion_*>,_std::allocator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>_>
         ::find((map<OpenMD::Torsion_*,_OpenMD::TorsionDataSet,_std::less<OpenMD::Torsion_*>,_std::allocator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>_>
                 *)in_stack_fffffffffffff948,(key_type *)0x31a480);
    local_310._M_node =
         (_Base_ptr)
         std::
         map<OpenMD::Torsion_*,_OpenMD::TorsionDataSet,_std::less<OpenMD::Torsion_*>,_std::allocator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>_>
         ::end((map<OpenMD::Torsion_*,_OpenMD::TorsionDataSet,_std::less<OpenMD::Torsion_*>,_std::allocator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>_>
                *)in_stack_fffffffffffff948);
    bVar4 = std::operator==(&local_308,&local_310);
    if (bVar4) {
      local_320 = local_2f8;
      local_330 = local_2f8;
      local_318 = local_300;
      local_328 = local_300;
      local_338 = 0;
      std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>::
      pair<OpenMD::Torsion_*&,_OpenMD::TorsionDataSet_&,_true>
                ((pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet> *)in_stack_fffffffffffff950,
                 (Torsion **)in_stack_fffffffffffff948,(TorsionDataSet *)0x31a537);
      pVar11 = std::
               map<OpenMD::Torsion_*,_OpenMD::TorsionDataSet,_std::less<OpenMD::Torsion_*>,_std::allocator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>_>
               ::insert((map<OpenMD::Torsion_*,_OpenMD::TorsionDataSet,_std::less<OpenMD::Torsion_*>,_std::allocator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>_>
                         *)in_stack_fffffffffffff960,(value_type *)in_stack_fffffffffffff958);
      local_378 = (_Base_ptr)pVar11.first._M_node;
      local_370 = pVar11.second;
    }
    else {
      ppVar7 = std::_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>
                           *)0x31a56d);
      RVar9 = (ppVar7->second).curr.angle;
      ppVar7 = std::_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>
                           *)0x31a588);
      (ppVar7->second).prev.angle = RVar9;
      ppVar7 = std::_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>
                           *)0x31a5a3);
      RVar9 = (ppVar7->second).curr.potential;
      ppVar7 = std::_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>
                           *)0x31a5be);
      RVar3 = local_2f8;
      (ppVar7->second).prev.potential = RVar9;
      ppVar7 = std::_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>
                           *)0x31a5eb);
      RVar9 = local_300;
      (ppVar7->second).curr.angle = RVar3;
      ppVar7 = std::_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>
                           *)0x31a618);
      (ppVar7->second).curr.potential = RVar9;
      ppVar7 = std::_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>
                           *)0x31a633);
      dVar1 = (ppVar7->second).curr.potential;
      ppVar7 = std::_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>
                           *)0x31a64e);
      dVar2 = (ppVar7->second).prev.potential;
      ppVar7 = std::_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>
                           *)0x31a67d);
      (ppVar7->second).deltaV = ABS(dVar1 - dVar2);
    }
    if ((*(byte *)(in_RDI + 0x220) & 1) != 0) {
      Torsion::getAtomA((Torsion *)0x31a6c3);
      bVar4 = SelectionManager::isSelected(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
      if (!bVar4) {
        Torsion::getAtomB((Torsion *)0x31a6fe);
        bVar4 = SelectionManager::isSelected(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
        if (!bVar4) {
          Torsion::getAtomC((Torsion *)0x31a735);
          bVar4 = SelectionManager::isSelected(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
          if (!bVar4) {
            Torsion::getAtomD((Torsion *)0x31a769);
            bVar4 = SelectionManager::isSelected
                              (in_stack_fffffffffffff950,in_stack_fffffffffffff948);
            if (!bVar4) goto LAB_0031a7b1;
          }
        }
      }
      RVar9 = Torsion::getPotential(local_38);
      pdVar5 = Vector<double,_7U>::operator[](&local_c8,6);
      *pdVar5 = RVar9 + *pdVar5;
    }
LAB_0031a7b1:
    local_38 = Molecule::nextTorsion
                         (in_stack_fffffffffffff970,(iterator *)in_stack_fffffffffffff968);
  }
  local_40 = Molecule::beginInversion
                       (in_stack_fffffffffffff970,(iterator *)in_stack_fffffffffffff968);
  do {
    if (local_40 == (Inversion *)0x0) {
      this_00 = SimInfo::getSnapshotManager(*(SimInfo **)(in_RDI + 0x18));
      this_01 = SnapshotManager::getCurrentSnapshot(this_00);
      Snapshot::setBondPotential(this_01,local_78);
      Snapshot::setBendPotential(this_01,local_80);
      Snapshot::setTorsionPotential(this_01,local_88);
      Snapshot::setInversionPotential(this_01,local_90);
      Vector<double,_7U>::Vector
                (in_stack_fffffffffffff960,(Vector<double,_7U> *)in_stack_fffffffffffff958);
      Snapshot::setSelectionPotentials(this_01,(potVec *)in_stack_fffffffffffff948);
      return;
    }
    (*(local_40->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[9])
              (local_40,&local_380,(ulong)(*(byte *)(in_RDI + 9) & 1));
    local_388 = Inversion::getPotential(local_40);
    RVar9 = Inversion::getPotential(local_40);
    local_90 = RVar9 + local_90;
    local_390._M_node =
         (_Base_ptr)
         std::
         map<OpenMD::Inversion_*,_OpenMD::InversionDataSet,_std::less<OpenMD::Inversion_*>,_std::allocator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>_>
         ::find((map<OpenMD::Inversion_*,_OpenMD::InversionDataSet,_std::less<OpenMD::Inversion_*>,_std::allocator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>_>
                 *)in_stack_fffffffffffff948,(key_type *)0x31a879);
    local_398._M_node =
         (_Base_ptr)
         std::
         map<OpenMD::Inversion_*,_OpenMD::InversionDataSet,_std::less<OpenMD::Inversion_*>,_std::allocator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>_>
         ::end((map<OpenMD::Inversion_*,_OpenMD::InversionDataSet,_std::less<OpenMD::Inversion_*>,_std::allocator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>_>
                *)in_stack_fffffffffffff948);
    bVar4 = std::operator==(&local_390,&local_398);
    if (bVar4) {
      std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>::
      pair<OpenMD::Inversion_*&,_OpenMD::InversionDataSet_&,_true>
                ((pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet> *)
                 in_stack_fffffffffffff950,(Inversion **)in_stack_fffffffffffff948,
                 (InversionDataSet *)0x31a92d);
      std::
      map<OpenMD::Inversion_*,_OpenMD::InversionDataSet,_std::less<OpenMD::Inversion_*>,_std::allocator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>_>
      ::insert((map<OpenMD::Inversion_*,_OpenMD::InversionDataSet,_std::less<OpenMD::Inversion_*>,_std::allocator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>_>
                *)in_stack_fffffffffffff960,in_stack_fffffffffffff958);
    }
    else {
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>
                           *)0x31a960);
      RVar9 = (ppVar8->second).curr.angle;
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>
                           *)0x31a978);
      (ppVar8->second).prev.angle = RVar9;
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>
                           *)0x31a990);
      RVar9 = (ppVar8->second).curr.potential;
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>
                           *)0x31a9a8);
      RVar3 = local_380;
      (ppVar8->second).prev.potential = RVar9;
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>
                           *)0x31a9cf);
      RVar9 = local_388;
      (ppVar8->second).curr.angle = RVar3;
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>
                           *)0x31a9f6);
      (ppVar8->second).curr.potential = RVar9;
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>
                           *)0x31aa0e);
      dVar1 = (ppVar8->second).curr.potential;
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>
                           *)0x31aa26);
      dVar2 = (ppVar8->second).prev.potential;
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>::
               operator->((_Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>
                           *)0x31aa4f);
      (ppVar8->second).deltaV = ABS(dVar1 - dVar2);
    }
    if ((*(byte *)(in_RDI + 0x220) & 1) != 0) {
      Inversion::getAtomA((Inversion *)0x31aa8f);
      bVar4 = SelectionManager::isSelected(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
      if (!bVar4) {
        in_stack_fffffffffffff970 = (Molecule *)(in_RDI + 0x248);
        Inversion::getAtomB((Inversion *)0x31aac4);
        bVar4 = SelectionManager::isSelected(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
        if (!bVar4) {
          in_stack_fffffffffffff968 = (iterator *)(in_RDI + 0x248);
          Inversion::getAtomC((Inversion *)0x31aaf5);
          bVar4 = SelectionManager::isSelected(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
          if (!bVar4) {
            in_stack_fffffffffffff960 = (Vector<double,_7U> *)(in_RDI + 0x248);
            Inversion::getAtomD((Inversion *)0x31ab26);
            bVar4 = SelectionManager::isSelected
                              (in_stack_fffffffffffff950,in_stack_fffffffffffff948);
            if (!bVar4) goto LAB_0031ab6e;
          }
        }
      }
      in_stack_fffffffffffff958 = (value_type *)Inversion::getPotential(local_40);
      pdVar5 = Vector<double,_7U>::operator[](&local_c8,6);
      *pdVar5 = (double)in_stack_fffffffffffff958 + *pdVar5;
    }
LAB_0031ab6e:
    local_40 = Molecule::nextInversion
                         (in_stack_fffffffffffff970,(iterator *)in_stack_fffffffffffff968);
  } while( true );
}

Assistant:

void ForceManager::selectedShortRangeInteractions(Molecule* mol1,
                                                    Molecule* mol2) {
    RigidBody* rb;
    Bond* bond;
    Bend* bend;
    Torsion* torsion;
    Inversion* inversion;
    SimInfo::MoleculeIterator mi;
    Molecule::RigidBodyIterator rbIter;
    Molecule::BondIterator bondIter;
    Molecule::BendIterator bendIter;
    Molecule::TorsionIterator torsionIter;
    Molecule::InversionIterator inversionIter;
    RealType bondPotential      = 0.0;
    RealType bendPotential      = 0.0;
    RealType torsionPotential   = 0.0;
    RealType inversionPotential = 0.0;
    potVec selectionPotential(0.0);

    // First compute for mol1
    for (rb = mol1->beginRigidBody(rbIter); rb != NULL;
         rb = mol1->nextRigidBody(rbIter)) {
      rb->updateAtoms();
    }

    for (bond = mol1->beginBond(bondIter); bond != NULL;
         bond = mol1->nextBond(bondIter)) {
      bond->calcForce(doParticlePot_);
      bondPotential += bond->getPotential();
      if (doPotentialSelection_) {
        if (seleMan_.isSelected(bond->getAtomA()) ||
            seleMan_.isSelected(bond->getAtomB())) {
          selectionPotential[BONDED_FAMILY] += bond->getPotential();
        }
      }
    }

    for (bend = mol1->beginBend(bendIter); bend != NULL;
         bend = mol1->nextBend(bendIter)) {
      RealType angle;
      bend->calcForce(angle, doParticlePot_);
      RealType currBendPot = bend->getPotential();

      bendPotential += bend->getPotential();
      map<Bend*, BendDataSet>::iterator i = bendDataSets.find(bend);
      if (i == bendDataSets.end()) {
        BendDataSet dataSet;
        dataSet.prev.angle = dataSet.curr.angle = angle;
        dataSet.prev.potential = dataSet.curr.potential = currBendPot;
        dataSet.deltaV                                  = 0.0;
        bendDataSets.insert(map<Bend*, BendDataSet>::value_type(bend, dataSet));
      } else {
        i->second.prev.angle     = i->second.curr.angle;
        i->second.prev.potential = i->second.curr.potential;
        i->second.curr.angle     = angle;
        i->second.curr.potential = currBendPot;
        i->second.deltaV =
            fabs(i->second.curr.potential - i->second.prev.potential);
      }
      if (doPotentialSelection_) {
        if (seleMan_.isSelected(bend->getAtomA()) ||
            seleMan_.isSelected(bend->getAtomB()) ||
            seleMan_.isSelected(bend->getAtomC())) {
          selectionPotential[BONDED_FAMILY] += bend->getPotential();
        }
      }
    }

    for (torsion = mol1->beginTorsion(torsionIter); torsion != NULL;
         torsion = mol1->nextTorsion(torsionIter)) {
      RealType angle;
      torsion->calcForce(angle, doParticlePot_);
      RealType currTorsionPot = torsion->getPotential();
      torsionPotential += torsion->getPotential();
      map<Torsion*, TorsionDataSet>::iterator i = torsionDataSets.find(torsion);
      if (i == torsionDataSets.end()) {
        TorsionDataSet dataSet;
        dataSet.prev.angle = dataSet.curr.angle = angle;
        dataSet.prev.potential = dataSet.curr.potential = currTorsionPot;
        dataSet.deltaV                                  = 0.0;
        torsionDataSets.insert(
            map<Torsion*, TorsionDataSet>::value_type(torsion, dataSet));
      } else {
        i->second.prev.angle     = i->second.curr.angle;
        i->second.prev.potential = i->second.curr.potential;
        i->second.curr.angle     = angle;
        i->second.curr.potential = currTorsionPot;
        i->second.deltaV =
            fabs(i->second.curr.potential - i->second.prev.potential);
      }
      if (doPotentialSelection_) {
        if (seleMan_.isSelected(torsion->getAtomA()) ||
            seleMan_.isSelected(torsion->getAtomB()) ||
            seleMan_.isSelected(torsion->getAtomC()) ||
            seleMan_.isSelected(torsion->getAtomD())) {
          selectionPotential[BONDED_FAMILY] += torsion->getPotential();
        }
      }
    }

    for (inversion = mol1->beginInversion(inversionIter); inversion != NULL;
         inversion = mol1->nextInversion(inversionIter)) {
      RealType angle;
      inversion->calcForce(angle, doParticlePot_);
      RealType currInversionPot = inversion->getPotential();
      inversionPotential += inversion->getPotential();
      map<Inversion*, InversionDataSet>::iterator i =
          inversionDataSets.find(inversion);
      if (i == inversionDataSets.end()) {
        InversionDataSet dataSet;
        dataSet.prev.angle = dataSet.curr.angle = angle;
        dataSet.prev.potential = dataSet.curr.potential = currInversionPot;
        dataSet.deltaV                                  = 0.0;
        inversionDataSets.insert(
            map<Inversion*, InversionDataSet>::value_type(inversion, dataSet));
      } else {
        i->second.prev.angle     = i->second.curr.angle;
        i->second.prev.potential = i->second.curr.potential;
        i->second.curr.angle     = angle;
        i->second.curr.potential = currInversionPot;
        i->second.deltaV =
            fabs(i->second.curr.potential - i->second.prev.potential);
      }
      if (doPotentialSelection_) {
        if (seleMan_.isSelected(inversion->getAtomA()) ||
            seleMan_.isSelected(inversion->getAtomB()) ||
            seleMan_.isSelected(inversion->getAtomC()) ||
            seleMan_.isSelected(inversion->getAtomD())) {
          selectionPotential[BONDED_FAMILY] += inversion->getPotential();
        }
      }
    }

    // Next compute for mol2
    for (rb = mol2->beginRigidBody(rbIter); rb != NULL;
         rb = mol2->nextRigidBody(rbIter)) {
      rb->updateAtoms();
    }

    for (bond = mol2->beginBond(bondIter); bond != NULL;
         bond = mol2->nextBond(bondIter)) {
      bond->calcForce(doParticlePot_);
      bondPotential += bond->getPotential();
      if (doPotentialSelection_) {
        if (seleMan_.isSelected(bond->getAtomA()) ||
            seleMan_.isSelected(bond->getAtomB())) {
          selectionPotential[BONDED_FAMILY] += bond->getPotential();
        }
      }
    }

    for (bend = mol2->beginBend(bendIter); bend != NULL;
         bend = mol2->nextBend(bendIter)) {
      RealType angle;
      bend->calcForce(angle, doParticlePot_);
      RealType currBendPot = bend->getPotential();

      bendPotential += bend->getPotential();
      map<Bend*, BendDataSet>::iterator i = bendDataSets.find(bend);
      if (i == bendDataSets.end()) {
        BendDataSet dataSet;
        dataSet.prev.angle = dataSet.curr.angle = angle;
        dataSet.prev.potential = dataSet.curr.potential = currBendPot;
        dataSet.deltaV                                  = 0.0;
        bendDataSets.insert(map<Bend*, BendDataSet>::value_type(bend, dataSet));
      } else {
        i->second.prev.angle     = i->second.curr.angle;
        i->second.prev.potential = i->second.curr.potential;
        i->second.curr.angle     = angle;
        i->second.curr.potential = currBendPot;
        i->second.deltaV =
            fabs(i->second.curr.potential - i->second.prev.potential);
      }
      if (doPotentialSelection_) {
        if (seleMan_.isSelected(bend->getAtomA()) ||
            seleMan_.isSelected(bend->getAtomB()) ||
            seleMan_.isSelected(bend->getAtomC())) {
          selectionPotential[BONDED_FAMILY] += bend->getPotential();
        }
      }
    }

    for (torsion = mol2->beginTorsion(torsionIter); torsion != NULL;
         torsion = mol2->nextTorsion(torsionIter)) {
      RealType angle;
      torsion->calcForce(angle, doParticlePot_);
      RealType currTorsionPot = torsion->getPotential();
      torsionPotential += torsion->getPotential();
      map<Torsion*, TorsionDataSet>::iterator i = torsionDataSets.find(torsion);
      if (i == torsionDataSets.end()) {
        TorsionDataSet dataSet;
        dataSet.prev.angle = dataSet.curr.angle = angle;
        dataSet.prev.potential = dataSet.curr.potential = currTorsionPot;
        dataSet.deltaV                                  = 0.0;
        torsionDataSets.insert(
            map<Torsion*, TorsionDataSet>::value_type(torsion, dataSet));
      } else {
        i->second.prev.angle     = i->second.curr.angle;
        i->second.prev.potential = i->second.curr.potential;
        i->second.curr.angle     = angle;
        i->second.curr.potential = currTorsionPot;
        i->second.deltaV =
            fabs(i->second.curr.potential - i->second.prev.potential);
      }
      if (doPotentialSelection_) {
        if (seleMan_.isSelected(torsion->getAtomA()) ||
            seleMan_.isSelected(torsion->getAtomB()) ||
            seleMan_.isSelected(torsion->getAtomC()) ||
            seleMan_.isSelected(torsion->getAtomD())) {
          selectionPotential[BONDED_FAMILY] += torsion->getPotential();
        }
      }
    }

    for (inversion = mol2->beginInversion(inversionIter); inversion != NULL;
         inversion = mol2->nextInversion(inversionIter)) {
      RealType angle;
      inversion->calcForce(angle, doParticlePot_);
      RealType currInversionPot = inversion->getPotential();
      inversionPotential += inversion->getPotential();
      map<Inversion*, InversionDataSet>::iterator i =
          inversionDataSets.find(inversion);
      if (i == inversionDataSets.end()) {
        InversionDataSet dataSet;
        dataSet.prev.angle = dataSet.curr.angle = angle;
        dataSet.prev.potential = dataSet.curr.potential = currInversionPot;
        dataSet.deltaV                                  = 0.0;
        inversionDataSets.insert(
            map<Inversion*, InversionDataSet>::value_type(inversion, dataSet));
      } else {
        i->second.prev.angle     = i->second.curr.angle;
        i->second.prev.potential = i->second.curr.potential;
        i->second.curr.angle     = angle;
        i->second.curr.potential = currInversionPot;
        i->second.deltaV =
            fabs(i->second.curr.potential - i->second.prev.potential);
      }
      if (doPotentialSelection_) {
        if (seleMan_.isSelected(inversion->getAtomA()) ||
            seleMan_.isSelected(inversion->getAtomB()) ||
            seleMan_.isSelected(inversion->getAtomC()) ||
            seleMan_.isSelected(inversion->getAtomD())) {
          selectionPotential[BONDED_FAMILY] += inversion->getPotential();
        }
      }
    }

#ifdef IS_MPI
    // Collect from all nodes.  This should eventually be moved into a
    // SystemDecomposition, but this is a better place than in
    // Thermo to do the collection.

    MPI_Allreduce(MPI_IN_PLACE, &bondPotential, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &bendPotential, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &torsionPotential, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &inversionPotential, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &selectionPotential[BONDED_FAMILY], 1,
                  MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
#endif

    Snapshot* curSnapshot = info_->getSnapshotManager()->getCurrentSnapshot();

    curSnapshot->setBondPotential(bondPotential);
    curSnapshot->setBendPotential(bendPotential);
    curSnapshot->setTorsionPotential(torsionPotential);
    curSnapshot->setInversionPotential(inversionPotential);
    curSnapshot->setSelectionPotentials(selectionPotential);

    // RealType shortRangePotential = bondPotential + bendPotential +
    //   torsionPotential +  inversionPotential;

    // curSnapshot->setShortRangePotential(shortRangePotential);
  }